

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O2

aom_codec_err_t
aom_codec_set_cx_data_buf(aom_codec_ctx_t *ctx,aom_fixed_buf_t *buf,uint pad_before,uint pad_after)

{
  aom_codec_priv_t *paVar1;
  size_t sVar2;
  aom_codec_err_t aVar3;
  
  aVar3 = AOM_CODEC_INVALID_PARAM;
  if ((ctx != (aom_codec_ctx_t *)0x0) && (paVar1 = ctx->priv, paVar1 != (aom_codec_priv_t *)0x0)) {
    if (buf == (aom_fixed_buf_t *)0x0) {
      (paVar1->enc).cx_data_dst_buf.buf = (void *)0x0;
      (paVar1->enc).cx_data_dst_buf.sz = 0;
      (paVar1->enc).cx_data_pad_before = 0;
      (paVar1->enc).cx_data_pad_after = 0;
    }
    else {
      sVar2 = buf->sz;
      (paVar1->enc).cx_data_dst_buf.buf = buf->buf;
      (paVar1->enc).cx_data_dst_buf.sz = sVar2;
      paVar1 = ctx->priv;
      (paVar1->enc).cx_data_pad_before = pad_before;
      (paVar1->enc).cx_data_pad_after = pad_after;
    }
    aVar3 = AOM_CODEC_OK;
  }
  return aVar3;
}

Assistant:

aom_codec_err_t aom_codec_set_cx_data_buf(aom_codec_ctx_t *ctx,
                                          const aom_fixed_buf_t *buf,
                                          unsigned int pad_before,
                                          unsigned int pad_after) {
  if (!ctx || !ctx->priv) return AOM_CODEC_INVALID_PARAM;

  if (buf) {
    ctx->priv->enc.cx_data_dst_buf = *buf;
    ctx->priv->enc.cx_data_pad_before = pad_before;
    ctx->priv->enc.cx_data_pad_after = pad_after;
  } else {
    ctx->priv->enc.cx_data_dst_buf.buf = NULL;
    ctx->priv->enc.cx_data_dst_buf.sz = 0;
    ctx->priv->enc.cx_data_pad_before = 0;
    ctx->priv->enc.cx_data_pad_after = 0;
  }

  return AOM_CODEC_OK;
}